

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O2

QPoint QtGuiTest::toNativePixels(QPoint *value,QWindow *window)

{
  QWindow *window_00;
  QPoint *pQVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QDebug local_58;
  QPoint local_50 [2];
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar1 = (QPoint *)QDebug::operator<<(&local_58,"Calculating native pixels: ");
    local_50[0] = *pQVar1;
    *(int *)((long)local_50[0] + 0x28) = *(int *)((long)local_50[0] + 0x28) + 1;
    window_00 = (QWindow *)(local_50 + 1);
    ::operator<<((QDebug *)window_00,local_50);
    ::operator<<((Stream *)local_40,window_00);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)window_00);
    QDebug::~QDebug((QDebug *)local_50);
    QDebug::~QDebug(&local_58);
  }
  QVar2 = QHighDpi::toNativePixels<QPoint,QWindow>(value,window);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QtGuiTest::toNativePixels(const QPoint &value, const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating native pixels: " << value << window;
    return QHighDpi::toNativePixels<QPoint, QWindow>(value, window);
}